

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O3

Result __thiscall
wabt::BinaryReaderLogging::OnTable
          (BinaryReaderLogging *this,Index index,Type elem_type,Limits *elem_limits)

{
  Enum EVar1;
  char *pcVar2;
  undefined4 in_register_00000014;
  char local_98 [8];
  char buf [100];
  
  anon_unknown_21::SPrintLimits
            (local_98,(size_t)elem_limits,(Limits *)CONCAT44(in_register_00000014,elem_type));
  WriteIndent(this);
  if (elem_type < Anyfunc) {
    if (elem_type == Void) {
      pcVar2 = "void";
      goto LAB_00f3aedf;
    }
    if (elem_type == Func) {
      pcVar2 = "func";
      goto LAB_00f3aedf;
    }
    if (elem_type == ExceptRef) {
      pcVar2 = "except_ref";
      goto LAB_00f3aedf;
    }
switchD_00f3ae6a_caseD_fffffff1:
    pcVar2 = "<type index>";
  }
  else {
    switch(elem_type) {
    case Any:
      pcVar2 = "any";
      break;
    case Anyfunc:
      pcVar2 = "anyfunc";
      break;
    default:
      goto switchD_00f3ae6a_caseD_fffffff1;
    case V128:
      pcVar2 = "v128";
      break;
    case F64:
      pcVar2 = "f64";
      break;
    case F32:
      pcVar2 = "f32";
      break;
    case I64:
      pcVar2 = "i64";
      break;
    case I32:
      pcVar2 = "i32";
    }
  }
LAB_00f3aedf:
  Stream::Writef(this->stream_,"OnTable(index: %u, elem_type: %s, %s)\n",(ulong)index,pcVar2,
                 local_98);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x1c])
                    (this->reader_,(ulong)index,(ulong)(uint)elem_type,elem_limits);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnTable(Index index,
                                    Type elem_type,
                                    const Limits* elem_limits) {
  char buf[100];
  SPrintLimits(buf, sizeof(buf), elem_limits);
  LOGF("OnTable(index: %" PRIindex ", elem_type: %s, %s)\n", index,
       GetTypeName(elem_type), buf);
  return reader_->OnTable(index, elem_type, elem_limits);
}